

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

bool __thiscall
Shell::EqualityProxyMono::getArgumentEqualityLiterals
          (EqualityProxyMono *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType,bool skipSortsWithoutEquality)

{
  bool bVar1;
  TermList arg0;
  Stack<Kernel::TermList> *in_RCX;
  Stack<Kernel::Literal_*> *in_RDX;
  uint in_ESI;
  OperatorType *in_RDI;
  Stack<Kernel::TermList> *in_R8;
  byte in_stack_00000008;
  TermList sort;
  TermList v2;
  TermList v1;
  uint i;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  TermList in_stack_ffffffffffffff60;
  EqualityProxyMono *in_stack_ffffffffffffff70;
  EqualityProxyMono *in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  TermList in_stack_ffffffffffffff88;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  Lib::Stack<Kernel::Literal_*>::reset(in_RDX);
  Lib::Stack<Kernel::TermList>::reset(in_RCX);
  Lib::Stack<Kernel::TermList>::reset(in_R8);
  local_38 = 0;
  do {
    if (in_ESI <= local_38) {
      bVar1 = Lib::Stack<Kernel::Literal_*>::isNonEmpty(in_RDX);
      return bVar1;
    }
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffff60._content,in_stack_ffffffffffffff5c,
               SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffff60._content,in_stack_ffffffffffffff5c,
               SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
    arg0 = Kernel::OperatorType::arg(in_RDI,(uint)(in_stack_ffffffffffffff60._content >> 0x20));
    if ((in_stack_00000008 & 1) == 0) {
LAB_00b91640:
      in_stack_ffffffffffffff60._content = (uint64_t)in_RDX;
      makeProxyLiteral(in_stack_ffffffffffffff78,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                       arg0,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff60._content,
                 (Literal *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      in_stack_ffffffffffffff88._content = (uint64_t)local_40;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff80._content = local_48;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff60);
    }
    else {
      bVar1 = haveProxyPredicate((EqualityProxyMono *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                 in_stack_ffffffffffffff60);
      if (bVar1) goto LAB_00b91640;
      in_stack_ffffffffffffff78 = local_40;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff70 = local_40;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff60);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool EqualityProxyMono::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType, bool skipSortsWithoutEquality)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if (!skipSortsWithoutEquality || haveProxyPredicate(sort)) {
      lits.push(makeProxyLiteral(false, v1, v2, sort));
      vars1.push(v1);
      vars2.push(v2);
    }
    else {
      vars1.push(v1);
      vars2.push(v1);
    }
  }
  return lits.isNonEmpty();
}